

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverAPGD.cpp
# Opt level: O3

void __thiscall
chrono::ChSolverAPGD::ShurBvectorCompute(ChSolverAPGD *this,ChSystemDescriptor *sysd)

{
  ChVariables *this_00;
  double *pdVar1;
  double *pdVar2;
  bool bVar3;
  Index size;
  pointer ppCVar4;
  long lVar5;
  pointer ppCVar6;
  pointer ppCVar7;
  pointer ppCVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  undefined1 auVar13 [64];
  double in_XMM0_Qa;
  long local_88;
  long local_80;
  long local_70;
  undefined8 uStack_68;
  ChVectorRef local_60;
  ChVectorRef local_48;
  
  ppCVar4 = (sysd->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar7 = (sysd->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar7 != ppCVar4) {
    uVar11 = 1;
    uVar9 = 0;
    do {
      this_00 = ppCVar4[uVar9];
      if (this_00->disabled == false) {
        ChVariables::Get_qb(&local_48,this_00);
        ChVariables::Get_fb(&local_60,
                            (sysd->vvariables).
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar9]);
        in_XMM0_Qa = 0.0;
        local_70 = 0;
        uStack_68 = 0;
        local_88 = local_60.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_;
        local_80 = local_60.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._8_8_;
        if ((long)local_60.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ._8_8_ < 0 &&
            local_60.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ != 0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                       );
        }
        (*this_00->_vptr_ChVariables[4])(this_00,&local_48,&local_88);
        if (local_70 != 0) {
          free(*(void **)(local_70 + -8));
        }
        ppCVar4 = (sysd->vvariables).
                  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppCVar7 = (sysd->vvariables).
                  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar9 = (ulong)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar9 < (ulong)((long)ppCVar7 - (long)ppCVar4 >> 3));
  }
  lVar5 = (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (-1 < lVar5) {
    if (lVar5 != 0) {
      memset((this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data,0,lVar5 << 3);
    }
    ppCVar6 = (sysd->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppCVar8 = (sysd->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppCVar8 != ppCVar6) {
      iVar12 = 0;
      uVar9 = 0;
      uVar10 = 1;
      do {
        if (ppCVar6[uVar9]->active == true) {
          (*ppCVar6[uVar9]->_vptr_ChConstraint[7])();
          if ((iVar12 < 0) ||
             (lVar5 = (long)iVar12,
             (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows <= lVar5)) {
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          iVar12 = iVar12 + 1;
          (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [lVar5] = in_XMM0_Qa;
          ppCVar6 = (sysd->vconstraints).
                    super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppCVar8 = (sysd->vconstraints).
                    super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        bVar3 = uVar10 < (ulong)((long)ppCVar8 - (long)ppCVar6 >> 3);
        uVar9 = uVar10;
        uVar10 = (ulong)((int)uVar10 + 1);
      } while (bVar3);
    }
    (*sysd->_vptr_ChSystemDescriptor[0xd])(sysd,&this->tmp);
    uVar9 = (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    if (uVar9 == (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows) {
      pdVar1 = (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      pdVar2 = (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      uVar10 = uVar9 + 7;
      if (-1 < (long)uVar9) {
        uVar10 = uVar9;
      }
      uVar10 = uVar10 & 0xfffffffffffffff8;
      if (7 < (long)uVar9) {
        lVar5 = 0;
        do {
          auVar13 = vaddpd_avx512f(*(undefined1 (*) [64])(pdVar1 + lVar5),
                                   *(undefined1 (*) [64])(pdVar2 + lVar5));
          *(undefined1 (*) [64])(pdVar2 + lVar5) = auVar13;
          lVar5 = lVar5 + 8;
        } while (lVar5 < (long)uVar10);
      }
      if ((long)uVar10 < (long)uVar9) {
        do {
          pdVar2[uVar10] = pdVar1[uVar10] + pdVar2[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      return;
    }
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
                 );
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

void ChSolverAPGD::ShurBvectorCompute(ChSystemDescriptor& sysd) {
    // ***TO DO*** move the following thirty lines in a short function ChSystemDescriptor::ShurBvectorCompute() ?

    // Compute the b_shur vector in the Shur complement equation N*l = b_shur
    // with
    //   N_shur  = D'* (M^-1) * D
    //   b_shur  = - c + D'*(M^-1)*k = b_i + D'*(M^-1)*k
    // but flipping the sign of lambdas,  b_shur = - b_i - D'*(M^-1)*k
    // Do this in three steps:

    // Put (M^-1)*k    in  q  sparse vector of each variable..
    for (unsigned int iv = 0; iv < sysd.GetVariablesList().size(); iv++)
        if (sysd.GetVariablesList()[iv]->IsActive())
            sysd.GetVariablesList()[iv]->Compute_invMb_v(sysd.GetVariablesList()[iv]->Get_qb(),
                                                         sysd.GetVariablesList()[iv]->Get_fb());  // q = [M]'*fb

    // ...and now do  b_shur = - D'*q = - D'*(M^-1)*k ..
    r.setZero();
    int s_i = 0;
    for (unsigned int ic = 0; ic < sysd.GetConstraintsList().size(); ic++)
        if (sysd.GetConstraintsList()[ic]->IsActive()) {
            r(s_i, 0) = sysd.GetConstraintsList()[ic]->Compute_Cq_q();
            ++s_i;
        }

    // ..and finally do   b_shur = b_shur - c
    sysd.BuildBiVector(tmp);  // b_i   =   -c   = phi/h
    r += tmp;
}